

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCircBufferedStream.cpp
# Opt level: O1

TPZCircBufferedStream * __thiscall
TPZCircBufferedStream::operator=(TPZCircBufferedStream *this,TPZCircBufferedStream *other)

{
  size_t __n;
  char *__dest;
  
  this->fNAllocatedBytes = other->fNAllocatedBytes;
  if (this->fBuffer != (char *)0x0) {
    operator_delete__(this->fBuffer);
  }
  __dest = (char *)operator_new__(this->fNAllocatedBytes);
  this->fBuffer = __dest;
  __n = other->fSize;
  memcpy(__dest,other->fBuffer,__n);
  this->fSize = __n;
  this->fFirst = __dest;
  this->fLast = __dest + (__n - 1);
  return this;
}

Assistant:

TPZCircBufferedStream &TPZCircBufferedStream::
operator=(const TPZCircBufferedStream &other) {
    fNAllocatedBytes = other.fNAllocatedBytes;
    if (fBuffer)
        delete[] fBuffer;
    fBuffer = new char[fNAllocatedBytes];
    memcpy(fBuffer, other.fBuffer, other.fSize);
    fSize = other.fSize;
    fFirst = fBuffer;
    fLast = fBuffer - 1 + fSize;
    return *this;
}